

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlane,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcPlane *in;
  
  in = (IfcPlane *)operator_new(0x70);
  *(undefined ***)&(in->super_IfcElementarySurface).field_0x58 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x60 = 0;
  *(char **)&in->field_0x68 = "IfcPlane";
  Assimp::IFC::Schema_2x3::IfcElementarySurface::IfcElementarySurface
            ((IfcElementarySurface *)in,&PTR_construction_vtable_24__00824470);
  (in->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPlane_00824390;
  *(undefined ***)&(in->super_IfcElementarySurface).field_0x58 = &PTR__IfcPlane_00824458;
  *(undefined ***)
   &(in->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcPlane_008243b8;
  *(undefined ***)
   &(in->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcPlane_008243e0;
  *(undefined ***)
   &(in->super_IfcElementarySurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    field_0x30 = &PTR__IfcPlane_00824408;
  *(undefined ***)&(in->super_IfcElementarySurface).field_0x48 = &PTR__IfcPlane_00824430;
  GenericFill<Assimp::IFC::Schema_2x3::IfcPlane>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcElementarySurface).super_IfcSurface.
                 super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcElementarySurface).super_IfcSurface.
               super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }